

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRuntimeDependencyArchive.cxx
# Opt level: O2

string * __thiscall
cmRuntimeDependencyArchive::GetGetRuntimeDependenciesTool_abi_cxx11_
          (cmRuntimeDependencyArchive *this)

{
  cmMakefile *this_00;
  string *psVar1;
  allocator<char> local_31;
  string local_30;
  
  this_00 = this->Status->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"CMAKE_GET_RUNTIME_DEPENDENCIES_TOOL",&local_31);
  psVar1 = cmMakefile::GetSafeDefinition(this_00,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return psVar1;
}

Assistant:

cmMakefile* cmRuntimeDependencyArchive::GetMakefile() const
{
  return &this->Status.GetMakefile();
}